

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O1

ostream * Gudhi::Persistence_representations::operator<<(ostream *out,Persistence_landscape *land)

{
  double dVar1;
  pointer pvVar2;
  ostream *poVar3;
  pointer ppVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  if ((land->land).
      super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (land->land).
      super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar8 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out,"Lambda_",7);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      pvVar2 = (land->land).
               super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar4 = *(pointer *)
                &pvVar2[lVar8].
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl;
      if (*(pointer *)
           ((long)&pvVar2[lVar8].
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl + 8) != ppVar4) {
        lVar7 = 0;
        lVar6 = 0;
        do {
          dVar1 = *(double *)((long)&ppVar4->first + lVar7);
          if ((dVar1 != -2147483647.0) || (NAN(dVar1))) {
            if ((dVar1 == 2147483647.0) && (!NAN(dVar1))) {
              pcVar5 = "+inf";
              goto LAB_00103c27;
            }
            std::ostream::_M_insert<double>(dVar1);
          }
          else {
            pcVar5 = "-inf";
LAB_00103c27:
            std::__ostream_insert<char,std::char_traits<char>>(out,pcVar5,4);
          }
          std::__ostream_insert<char,std::char_traits<char>>(out," , ",3);
          poVar3 = std::ostream::_M_insert<double>
                             (*(double *)
                               (*(long *)&(land->land).
                                          super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                          ._M_impl + 8 + lVar7));
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          lVar6 = lVar6 + 1;
          pvVar2 = (land->land).
                   super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar4 = *(pointer *)
                    &pvVar2[lVar8].
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl;
          lVar7 = lVar7 + 0x10;
        } while (lVar6 != (long)*(pointer *)
                                 ((long)&pvVar2[lVar8].
                                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                         ._M_impl + 8) - (long)ppVar4 >> 4);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != ((long)(land->land).
                             super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(land->land).
                             super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, Persistence_landscape& land) {
  for (size_t level = 0; level != land.land.size(); ++level) {
    out << "Lambda_" << level << ":" << std::endl;
    for (size_t i = 0; i != land.land[level].size(); ++i) {
      if (land.land[level][i].first == -std::numeric_limits<int>::max()) {
        out << "-inf";
      } else {
        if (land.land[level][i].first == std::numeric_limits<int>::max()) {
          out << "+inf";
        } else {
          out << land.land[level][i].first;
        }
      }
      out << " , " << land.land[level][i].second << std::endl;
    }
  }
  return out;
}